

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O3

void distributeMultiBox(QList<QLayoutStruct> *chain,int start,int end,int minSize,int sizeHint,
                       QList<int> *stretchArray,int stretch)

{
  int iVar1;
  pointer pQVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  bool bVar12;
  
  iVar8 = 0;
  iVar11 = 0;
  iVar6 = 0;
  iVar1 = end - start;
  if (start <= end) {
    lVar9 = (long)end - (long)start;
    lVar7 = (long)start << 2;
    iVar4 = iVar1 + 1;
    iVar6 = 0;
    iVar11 = 0;
    iVar8 = 0;
    do {
      pQVar2 = QList<QLayoutStruct>::data(chain);
      if (*(int *)((long)(stretchArray->d).ptr + lVar7) == 0) {
        iVar3 = (&pQVar2->stretch)[lVar7 * 2];
        if ((&pQVar2->stretch)[lVar7 * 2] <= stretch) {
          iVar3 = stretch;
        }
        (&pQVar2->stretch)[lVar7 * 2] = iVar3;
      }
      iVar3 = 0;
      bVar12 = lVar9 != 0;
      lVar9 = lVar9 + -1;
      if (bVar12) {
        iVar3 = (&pQVar2->spacing)[lVar7 * 2];
      }
      iVar8 = iVar8 + (&pQVar2->maximumSize)[lVar7 * 2] + iVar3;
      iVar11 = iVar11 + (&pQVar2->sizeHint)[lVar7 * 2] + iVar3;
      iVar6 = iVar6 + (&pQVar2->minimumSize)[lVar7 * 2] + iVar3;
      lVar7 = lVar7 + 4;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  if (iVar8 < minSize) {
    qGeomCalc(chain,start,iVar1 + 1,0,minSize,-1);
    if (start <= end) {
      lVar7 = (long)end - (long)start;
      lVar9 = (long)start << 5;
      lVar10 = 0;
      iVar6 = 0;
      do {
        pQVar2 = QList<QLayoutStruct>::data(chain);
        iVar8 = minSize;
        if (lVar7 != lVar10) {
          iVar8 = *(int *)((long)&(chain->d).ptr[1].pos + lVar9);
        }
        iVar4 = 0;
        if (lVar7 != lVar10) {
          iVar4 = *(int *)((long)&pQVar2->spacing + lVar9);
        }
        iVar4 = iVar8 - (iVar6 + iVar4);
        iVar6 = *(int *)((long)&pQVar2->minimumSize + lVar9);
        if (iVar6 < iVar4) {
          *(int *)((long)&pQVar2->minimumSize + lVar9) = iVar4;
          iVar6 = iVar4;
        }
        if (*(int *)((long)&pQVar2->maximumSize + lVar9) < iVar6) {
          *(int *)((long)&pQVar2->maximumSize + lVar9) = iVar6;
        }
        lVar10 = lVar10 + 1;
        lVar9 = lVar9 + 0x20;
        iVar6 = iVar8;
      } while ((end - start) + 1 != (int)lVar10);
    }
  }
  else if (iVar6 < minSize) {
    qGeomCalc(chain,start,iVar1 + 1,0,minSize,-1);
    if (start <= end) {
      uVar5 = (long)start << 5 | 0xc;
      iVar6 = (end - start) + 1;
      do {
        pQVar2 = QList<QLayoutStruct>::data(chain);
        iVar8 = *(int *)((long)&pQVar2->spacing + uVar5);
        if (*(int *)((long)&pQVar2->stretch + uVar5) < iVar8) {
          *(int *)((long)&pQVar2->stretch + uVar5) = iVar8;
        }
        uVar5 = uVar5 + 0x20;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
  }
  if (iVar11 < sizeHint) {
    qGeomCalc(chain,start,iVar1 + 1,0,sizeHint,-1);
    if (start <= end) {
      uVar5 = (long)start << 5 | 4;
      iVar1 = (end - start) + 1;
      do {
        pQVar2 = QList<QLayoutStruct>::data(chain);
        iVar6 = *(int *)((long)&pQVar2->pos + uVar5);
        if (*(int *)((long)&pQVar2->stretch + uVar5) < iVar6) {
          *(int *)((long)&pQVar2->stretch + uVar5) = iVar6;
        }
        uVar5 = uVar5 + 0x20;
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
  }
  return;
}

Assistant:

static void distributeMultiBox(QList<QLayoutStruct> &chain, int start, int end, int minSize,
                               int sizeHint, QList<int> &stretchArray, int stretch)
{
    int i;
    int w = 0;
    int wh = 0;
    int max = 0;

    for (i = start; i <= end; i++) {
        QLayoutStruct *data = &chain[i];
        w += data->minimumSize;
        wh += data->sizeHint;
        max += data->maximumSize;
        if (stretchArray.at(i) == 0)
            data->stretch = qMax(data->stretch, stretch);

        if (i != end) {
            int spacing = data->spacing;
            w += spacing;
            wh += spacing;
            max += spacing;
        }
    }

    if (max < minSize) { // implies w < minSize
        /*
          We must increase the maximum size of at least one of the
          items. qGeomCalc() will put the extra space in between the
          items. We must recover that extra space and put it
          somewhere. It does not really matter where, since the user
          can always specify stretch factors and avoid this code.
        */
        qGeomCalc(chain, start, end - start + 1, 0, minSize);
        int pos = 0;
        for (i = start; i <= end; i++) {
            QLayoutStruct *data = &chain[i];
            int nextPos = (i == end) ? minSize : chain.at(i + 1).pos;
            int realSize = nextPos - pos;
            if (i != end)
                realSize -= data->spacing;
            if (data->minimumSize < realSize)
                data->minimumSize = realSize;
            if (data->maximumSize < data->minimumSize)
                data->maximumSize = data->minimumSize;
            pos = nextPos;
        }
    } else if (w < minSize) {
        qGeomCalc(chain, start, end - start + 1, 0, minSize);
        for (i = start; i <= end; i++) {
            QLayoutStruct *data = &chain[i];
            if (data->minimumSize < data->size)
                data->minimumSize = data->size;
        }
    }

    if (wh < sizeHint) {
        qGeomCalc(chain, start, end - start + 1, 0, sizeHint);
        for (i = start; i <= end; i++) {
            QLayoutStruct *data = &chain[i];
            if (data->sizeHint < data->size)
                data->sizeHint = data->size;
        }
    }
}